

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O2

void __thiscall Decrypt::operator()(Decrypt *this,string *inputPath,ostream *os)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  size_t *outlen;
  uchar *out;
  uchar *out_00;
  uchar *in_R8;
  size_t in_R9;
  bool bVar4;
  char deadChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  SequenceD<64> seq;
  ifstream is;
  uint auStack_398 [124];
  ostringstream oss;
  
  std::ifstream::ifstream(&is,(string *)inputPath,_S_in|_S_bin|_S_ate);
  puVar1 = (uint *)((long)auStack_398 + *(long *)(_is + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  lVar2 = std::istream::tellg();
  std::istream::seekg((long)&is,_S_beg);
  std::operator>>((istream *)&is,&deadChars);
  SequenceD<64>::SequenceD(&seq);
  outlen = (size_t *)(ulong)('\0' < deadChars);
  lVar3 = lVar2 / 8 - (long)outlen;
  lVar2 = 0;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    operator>>((istream *)&is,&seq);
    decrypt(this,(EVP_PKEY_CTX *)&seq,out,outlen,in_R8,in_R9);
    operator<<(os,&seq);
  }
  if ('\0' < deadChars) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    operator>>((istream *)&is,&seq);
    decrypt(this,(EVP_PKEY_CTX *)&seq,out_00,outlen,in_R8,in_R9);
    operator<<((ostream *)&oss,&seq);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_480,&local_4a0,0,8 - (long)deadChars);
    std::operator<<(os,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  std::ifstream::close();
  SequenceD<64>::~SequenceD(&seq);
  std::ifstream::~ifstream(&is);
  return;
}

Assistant:

void Decrypt::operator()(const std::string &inputPath, std::ostream &os) {
    // Read input file and tell it to not ignore whitespaces while reading
    std::ifstream is(inputPath, std::ios::in | std::ios::binary | std::ios::ate);
    is >> std::noskipws;

    auto size = is.tellg();
    is.seekg(0, std::ios::beg);

    // Read the number of dead characters upfront so that we know how to truncate
    // input at the end.
    char deadChars;
    is >> deadChars;

    // Decypher each sequence in a streaming fashion
    SequenceD<64> seq;
    auto total = (size / 8) - (deadChars > 0 ? 1 : 0);
    for (auto i = 0; i < total; ++i) {
        is >> seq;
        os << decrypt(seq);
    }

    // If there is at least one dead character...
    if (deadChars > 0) {
        // Read last  sequence in a string stream
        std::ostringstream oss{};
        is >> seq;
        oss << decrypt(seq);
        // and truncate resul
        os << oss.str().substr(0, 8 - deadChars);
    }

    is.close();
}